

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::Int64Option::giveRndValue(Int64Option *this,string *optionText)

{
  int iVar1;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostringstream strs;
  int64_t rndV;
  ostringstream *this_00;
  string local_220 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  string local_1e0 [32];
  string local_1c0 [48];
  ostringstream local_190 [376];
  long local_18;
  string *local_10;
  
  local_18 = *(long *)(in_RDI + 0x30);
  local_10 = in_RSI;
  iVar1 = rand();
  for (local_18 = iVar1 + local_18; *(long *)(in_RDI + 0x38) < local_18;
      local_18 = local_18 - (*(long *)(in_RDI + 0x38) - *(long *)(in_RDI + 0x30))) {
  }
  this_00 = local_190;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::ostream::operator<<(this_00,local_18);
  std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::operator+(in_RDI,(char *)this_00);
  std::__cxx11::ostringstream::str();
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::__cxx11::string::operator=(local_10,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void giveRndValue(std::string &optionText)
    {
        int64_t rndV = range.begin;
        rndV += rand();
        while (rndV > range.end) {
            rndV -= range.end - range.begin;
        }
        std::ostringstream strs;
        strs << rndV;
        optionText = "-" + optionText + "=" + strs.str();
    }